

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

RGB __thiscall pbrt::MIPMap::Filter<pbrt::RGB>(MIPMap *this,Point2f st,Vector2f dst0,Vector2f dst1)

{
  float *pfVar1;
  FilterFunction FVar2;
  uint uVar3;
  float *pfVar4;
  Point2i PVar5;
  long lVar6;
  undefined4 extraout_var;
  Tuple2<pbrt::Point2,_int> st_00;
  int level;
  uint level_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined8 uVar11;
  undefined8 in_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [12];
  undefined1 auVar21 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar23 [16];
  undefined1 in_register_00001384 [12];
  RGB RVar24;
  int vb;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Tuple2<pbrt::Point2,_float> local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  Float va;
  float afStack_44 [3];
  undefined8 local_38;
  undefined1 local_28 [16];
  
  auVar22 = in_ZMM4._4_12_;
  auVar17._8_56_ = in_register_00001288;
  auVar17._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar15._8_56_ = in_register_00001248;
  auVar15._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar7 = auVar15._0_16_;
  _local_58 = auVar17._0_16_;
  if ((this->options).filter == EWA) {
    auVar12._0_4_ =
         dst0.super_Tuple2<pbrt::Vector2,_float>.x * dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar12._4_4_ =
         dst0.super_Tuple2<pbrt::Vector2,_float>.y * dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar12._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
    auVar12._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
    auVar20._0_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    auVar20._4_4_ =
         dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    auVar20._8_4_ = in_register_00001288._0_4_ * in_register_00001288._0_4_;
    auVar20._12_4_ = in_register_00001288._4_4_ * in_register_00001288._4_4_;
    auVar8 = vhaddps_avx(auVar12,auVar12);
    auVar9 = vhaddps_avx(auVar20,auVar20);
    auVar16 = auVar7;
    if (auVar9._0_4_ <= auVar8._0_4_) {
      auVar16 = _local_58;
      _local_58 = auVar7;
    }
    auVar7 = vinsertps_avx(auVar16,_local_58,0x1c);
    auVar8 = vinsertps_avx(_local_58,auVar16,0x4c);
    auVar13._0_4_ = auVar7._0_4_ * auVar7._0_4_ + auVar8._0_4_ * auVar8._0_4_;
    auVar13._4_4_ = auVar7._4_4_ * auVar7._4_4_ + auVar8._4_4_ * auVar8._4_4_;
    auVar13._8_4_ = auVar7._8_4_ * auVar7._8_4_ + auVar8._8_4_ * auVar8._8_4_;
    auVar13._12_4_ = auVar7._12_4_ * auVar7._12_4_ + auVar8._12_4_ * auVar8._12_4_;
    auVar8 = vsqrtps_avx(auVar13);
    fVar10 = auVar8._0_4_;
    fVar19 = fVar10 * (this->options).maxAnisotropy;
    auVar7 = vinsertps_avx(auVar8,ZEXT416((uint)fVar19),0x1d);
    uVar11 = vcmpps_avx512vl(auVar7,auVar8,1);
    auVar23 = auVar16;
    if ((~(ushort)uVar11 & 3) == 0) {
      auVar7 = vmovshdup_avx(auVar8);
      fVar19 = auVar7._0_4_ / fVar19;
      fVar10 = fVar10 * fVar19;
      auVar23._0_4_ = auVar16._0_4_ * fVar19;
      auVar23._4_4_ = auVar16._4_4_ * fVar19;
      auVar23._8_4_ = auVar16._8_4_ * fVar19;
      auVar23._12_4_ = auVar16._12_4_ * fVar19;
    }
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      local_88._0_4_ = (float)((int)(this->pyramid).nStored + -1);
      local_78 = auVar23;
      local_68 = st.super_Tuple2<pbrt::Point2,_float>;
      fVar19 = logf(fVar10);
      auVar8 = vmaxss_avx(ZEXT416((uint)(fVar19 * 1.442695 + (float)local_88._0_4_)),ZEXT416(0));
      auVar7 = vroundss_avx(auVar8,auVar8,9);
      level = (int)auVar7._0_4_;
      auVar14._0_4_ = (int)auVar7._0_4_;
      auVar14._4_4_ = (int)auVar7._4_4_;
      auVar14._8_4_ = (int)auVar7._8_4_;
      auVar14._12_4_ = (int)auVar7._12_4_;
      auVar7 = vcvtdq2ps_avx(auVar14);
      fVar19 = auVar8._0_4_ - auVar7._0_4_;
      local_28 = ZEXT416((uint)fVar19);
      local_88 = ZEXT416((uint)(1.0 - fVar19));
      RVar24 = EWA<pbrt::RGB>(this,level,(Point2f)local_68,(Vector2f)local_58,
                              (Vector2f)local_78._0_8_);
      local_38 = RVar24._0_8_;
      fVar19 = RVar24.b * (float)local_88._0_4_;
      RVar24 = EWA<pbrt::RGB>(this,level + 1,(Point2f)local_68,(Vector2f)local_58,
                              (Vector2f)local_78._0_8_);
      fVar19 = RVar24.b * (float)local_28._0_4_ + fVar19;
      uVar11 = CONCAT44(RVar24.g * (float)local_28._0_4_ + (float)local_88._0_4_ * local_38._4_4_,
                        RVar24.r * (float)local_28._0_4_ + (float)local_88._0_4_ * (float)local_38);
LAB_0038cae3:
      RVar24.b = fVar19;
      RVar24.r = (Float)(int)uVar11;
      RVar24.g = (Float)(int)((ulong)uVar11 >> 0x20);
      return RVar24;
    }
    level_00 = 0;
  }
  else {
    auVar7 = vmovlhps_avx(auVar7,_local_58);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar7,auVar8);
    pfVar4 = &va;
    lVar6 = 4;
    _va = auVar7;
    do {
      pfVar1 = (float *)((long)afStack_44 + lVar6 + -4);
      fVar19 = *pfVar1;
      fVar10 = auVar7._0_4_;
      auVar7 = vmaxss_avx(ZEXT416((uint)fVar19),auVar7);
      if (fVar10 < fVar19) {
        pfVar4 = pfVar1;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    auVar7 = vmaxss_avx(SUB6416(ZEXT464(0x322bcc77),0),ZEXT416((uint)(*pfVar4 + *pfVar4)));
    local_78._0_4_ = (float)((int)(this->pyramid).nStored + -1);
    local_68 = st.super_Tuple2<pbrt::Point2,_float>;
    uStack_60 = in_XMM0_Qb;
    fVar19 = logf(auVar7._0_4_);
    fVar19 = fVar19 * 1.442695 + (float)local_78._0_4_;
    level_00 = (int)(this->pyramid).nStored - 1;
    if ((float)(int)level_00 <= fVar19) {
      st_00.x = 0;
      st_00.y = 0;
LAB_0038c950:
      RVar24 = Texel<pbrt::RGB>(this,level_00,(Point2i)st_00);
      return RVar24;
    }
    auVar7 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),9);
    uVar3 = (uint)auVar7._0_4_;
    level_00 = ~((int)uVar3 >> 0x1f) & uVar3;
    FVar2 = (this->options).filter;
    st.super_Tuple2<pbrt::Point2,_float> = local_68;
    if (FVar2 == Trilinear) {
      if (0 < (int)uVar3) {
        vb = 1;
        fVar19 = fVar19 - (float)(int)level_00;
        va = fVar19;
        local_78 = ZEXT416((uint)fVar19);
        if (1.0 < fVar19) {
          LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],float&,char_const(&)[2],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                     ,0xfe,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [6])0x3ec375,
                     (char (*) [2])0x2cb3628,(char (*) [6])0x3ec375,&va,(char (*) [2])0x2cb3628,&vb)
          ;
        }
        RVar24 = Bilerp<pbrt::RGB>(this,level_00,(Point2f)local_68);
        uStack_50 = uStack_60;
        local_58 = (undefined1  [8])RVar24._0_8_;
        local_88._0_4_ = RVar24.b;
        RVar24 = Bilerp<pbrt::RGB>(this,level_00 + 1,(Point2f)local_68);
        fVar10 = 1.0 - (float)local_78._0_4_;
        fVar19 = fVar10 * (float)local_88._0_4_ + (float)local_78._0_4_ * RVar24.b;
        uVar11 = CONCAT44(fVar10 * (float)local_58._4_4_ + (float)local_78._0_4_ * RVar24.g,
                          fVar10 * (float)local_58._0_4_ + (float)local_78._0_4_ * RVar24.r);
        goto LAB_0038cae3;
      }
      level_00 = 0;
    }
    else if (FVar2 != Bilinear) {
      if (FVar2 != Point) {
        LogFatal<char_const(&)[44]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                   ,0xf9,"Check failed: %s",
                   (char (*) [44])"options.filter == FilterFunction::Trilinear");
      }
      PVar5 = LevelResolution(this,level_00);
      auVar9._8_8_ = uStack_60;
      auVar9._0_4_ = local_68.x;
      auVar9._4_4_ = local_68.y;
      auVar18._8_4_ = 0x3effffff;
      auVar18._0_8_ = 0x3effffff3effffff;
      auVar18._12_4_ = 0x3effffff;
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar7._0_4_ = (float)PVar5.super_Tuple2<pbrt::Point2,_int>.x;
      auVar7._4_12_ = auVar22;
      auVar7 = vfmadd213ss_fma(auVar7,auVar9,SUB6416(ZEXT464(0xbf000000),0));
      auVar8 = vpternlogd_avx512vl(auVar18,auVar7,auVar16,0xf8);
      auVar7 = ZEXT416((uint)(auVar7._0_4_ + auVar8._0_4_));
      auVar8 = vroundss_avx(auVar7,auVar7,0xb);
      auVar7 = vmovshdup_avx(auVar9);
      auVar21._0_4_ = (float)PVar5.super_Tuple2<pbrt::Point2,_int>.y;
      auVar21._4_12_ = in_register_00001384;
      auVar7 = vfmadd213ss_fma(auVar21,auVar7,SUB6416(ZEXT464(0xbf000000),0));
      auVar9 = vpternlogd_avx512vl(auVar18,auVar7,auVar16,0xf8);
      auVar7 = ZEXT416((uint)(auVar7._0_4_ + auVar9._0_4_));
      auVar7 = vroundss_avx(auVar7,auVar7,0xb);
      st_00 = (Tuple2<pbrt::Point2,_int>)
              (CONCAT44(extraout_var,(int)auVar8._0_4_) | (ulong)(uint)(int)auVar7._0_4_ << 0x20);
      goto LAB_0038c950;
    }
  }
  RVar24 = Bilerp<pbrt::RGB>(this,level_00,st);
  return RVar24;
}

Assistant:

T MIPMap::Filter(Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        // Handle non-EWA MIP Map filter
        Float width = 2 * std::max({std::abs(dst0[0]), std::abs(dst0[1]),
                                    std::abs(dst1[0]), std::abs(dst1[1])});
        // Compute MIP Map level for _width_ and handle very wide filter
        int nLevels = Levels();
        Float level = nLevels - 1 + Log2(std::max<Float>(width, 1e-8));
        if (level >= Levels() - 1)
            return Texel<T>(Levels() - 1, {0, 0});
        int iLevel = std::max(0, int(std::floor(level)));

        if (options.filter == FilterFunction::Point) {
            // Return point-sampled value at selected MIP level
            Point2i resolution = LevelResolution(iLevel);
            Point2i sti(std::round(st[0] * resolution[0] - 0.5f),
                        std::round(st[1] * resolution[1] - 0.5f));
            return Texel<T>(iLevel, sti);

        } else if (options.filter == FilterFunction::Bilinear) {
            // Return bilinear-filtered value at selected MIP level
            return Bilerp<T>(iLevel, st);

        } else {
            // Return trilinear-filtered value at selected MIP level
            CHECK(options.filter == FilterFunction::Trilinear);
            if (iLevel == 0)
                return Bilerp<T>(0, st);
            else {
                Float delta = level - iLevel;
                CHECK_LE(delta, 1);
                return Lerp(delta, Bilerp<T>(iLevel, st), Bilerp<T>(iLevel + 1, st));
            }
        }
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0), minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}